

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorProto::MergePartialFromCodedStream
          (DescriptorProto *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar1;
  byte *pbVar2;
  char *data;
  bool bVar3;
  uint32 uVar4;
  UnknownFieldSet *unknown_fields;
  string *psVar5;
  DescriptorProto_ExtensionRange *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  Type *pTVar6;
  DescriptorProto *value_01;
  EnumDescriptorProto *value_02;
  OneofDescriptorProto *value_03;
  FieldDescriptorProto *value_04;
  MessageOptions *value_05;
  DescriptorProto_ReservedRange *value_06;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_01;
  char cVar7;
  uint tag;
  ulong uVar8;
  
  this_00 = &this->reserved_name_;
LAB_002f9c2a:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_002f9c4e;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_002f9c4e:
      uVar4 = io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar8 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar4 | uVar8;
    }
    tag = (uint)uVar8;
    if ((uVar8 & 0x100000000) == 0) goto switchD_002f9cbd_default;
    cVar7 = (char)uVar8;
    switch((uint)(uVar8 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar7 == '\n') {
        psVar5 = mutable_name_abi_cxx11_(this);
        bVar3 = internal::WireFormatLite::ReadBytes(input,psVar5);
        if (!bVar3) {
          return false;
        }
        psVar5 = (this->name_).ptr_;
        internal::WireFormatLite::VerifyUtf8String
                  ((psVar5->_M_dataplus)._M_p,(int)psVar5->_M_string_length,PARSE,
                   "google.protobuf.DescriptorProto.name");
        goto LAB_002f9c2a;
      }
      break;
    case 2:
      this_01 = &this->field_;
      if (cVar7 != '\x12') break;
LAB_002f9e12:
      value_04 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(this_01);
      bVar3 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::FieldDescriptorProto>
                        (input,value_04);
      goto LAB_002f9ca0;
    case 3:
      if (cVar7 == '\x1a') {
        value_01 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(&this->nested_type_);
        bVar3 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::DescriptorProto>
                          (input,value_01);
        goto LAB_002f9ca0;
      }
      break;
    case 4:
      if (cVar7 == '\"') {
        value_02 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Add(&this->enum_type_);
        bVar3 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::EnumDescriptorProto>(input,value_02);
        goto LAB_002f9ca0;
      }
      break;
    case 5:
      if (cVar7 == '*') {
        value = RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::Add
                          (&this->extension_range_);
        bVar3 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::DescriptorProto_ExtensionRange>(input,value);
        goto LAB_002f9ca0;
      }
      break;
    case 6:
      this_01 = &this->extension_;
      if (cVar7 == '2') goto LAB_002f9e12;
      break;
    case 7:
      if (cVar7 == ':') {
        value_05 = mutable_options(this);
        bVar3 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::MessageOptions>
                          (input,value_05);
        goto LAB_002f9ca0;
      }
      break;
    case 8:
      if (cVar7 == 'B') {
        value_03 = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::Add(&this->oneof_decl_)
        ;
        bVar3 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::OneofDescriptorProto>(input,value_03);
        goto LAB_002f9ca0;
      }
      break;
    case 9:
      if (cVar7 == 'J') {
        value_06 = RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::Add
                             (&this->reserved_range_);
        bVar3 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::DescriptorProto_ReservedRange>
                          (input,value_06);
        goto LAB_002f9ca0;
      }
      break;
    case 10:
      if (cVar7 == 'R') {
        value_00 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Add(this_00);
        bVar3 = internal::WireFormatLite::ReadBytes(input,value_00);
        if (!bVar3) {
          return false;
        }
        pTVar6 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ + -1);
        data = (pTVar6->_M_dataplus)._M_p;
        pTVar6 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ + -1);
        internal::WireFormatLite::VerifyUtf8String
                  (data,(int)pTVar6->_M_string_length,PARSE,
                   "google.protobuf.DescriptorProto.reserved_name");
        goto LAB_002f9c2a;
      }
    }
switchD_002f9cbd_default:
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    unknown_fields = mutable_unknown_fields(this);
    bVar3 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_002f9ca0:
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool DescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.DescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.DescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_field()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_nested_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension_range()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.MessageOptions options = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_oneof_decl()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_reserved_range()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string reserved_name = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_reserved_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->reserved_name(this->reserved_name_size() - 1).data(),
            this->reserved_name(this->reserved_name_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.DescriptorProto.reserved_name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.DescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.DescriptorProto)
  return false;
#undef DO_
}